

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash_test.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_b047::Decode_MismatchLengthAndDigestLength_Test::
~Decode_MismatchLengthAndDigestLength_Test(Decode_MismatchLengthAndDigestLength_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Decode, MismatchLengthAndDigestLength) {
	auto [_, optErr] = multihash::decode("02mydigest");
	ASSERT_TRUE(optErr) << "Expected an error. expected: '" << multihash::errInconsistantLength << "'";
	ASSERT_EQ(multihash::errInconsistantLength, optErr.value());

	std::tie(_, optErr) = multihash::decode("0999mydigest");
	ASSERT_TRUE(optErr) << "Expected an error. expected: '" << multihash::errInconsistantLength << "'";
	ASSERT_EQ(multihash::errInconsistantLength, optErr.value());
}